

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseColGroup(TidyDocImpl *doc,Node *colgroup,GetTokenMode mode)

{
  int iVar1;
  TidyParserMemory *pTVar2;
  Dict *pDVar3;
  Bool BVar4;
  long lVar5;
  Node *node;
  Node *pNVar6;
  Node **ppNVar7;
  
  if (colgroup == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    lVar5 = (long)iVar1;
    if (lVar5 < 0) {
      colgroup = (Node *)0x0;
      mode = IgnoreWhitespace;
    }
    else {
      pTVar2 = (doc->stack).content;
      colgroup = pTVar2[lVar5].original_node;
      mode = pTVar2[lVar5].mode;
      (doc->stack).top = iVar1 + -1;
    }
  }
  else if ((colgroup->tag->model & 1) != 0) {
    return (Node *)0x0;
  }
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node == (Node *)0x0) {
    return (Node *)0x0;
  }
  do {
    pDVar3 = node->tag;
    if (pDVar3 == colgroup->tag) {
      if (node->type == EndTag) {
        prvTidyFreeNode(doc,node);
        colgroup->closed = yes;
        return (Node *)0x0;
      }
LAB_0013bd1c:
      BVar4 = prvTidynodeIsText(node);
      if (BVar4 != no) {
LAB_0013bd84:
        prvTidyUngetToken(doc);
        return (Node *)0x0;
      }
      BVar4 = InsertMisc(colgroup,node);
      if (BVar4 == no) {
        if (node->tag != (Dict *)0x0) {
          if (node->tag->id != TidyTag_COL) goto LAB_0013bd84;
          if (node->type != EndTag) {
            node->parent = colgroup;
            if (colgroup == (Node *)0x0) {
              node->prev = (Node *)0x0;
            }
            else {
              pNVar6 = colgroup->last;
              node->prev = pNVar6;
              ppNVar7 = &pNVar6->next;
              if (pNVar6 == (Node *)0x0) {
                ppNVar7 = &colgroup->content;
              }
              *ppNVar7 = node;
              colgroup->last = node;
            }
            prvTidypushMemory(doc,(TidyParserMemory)
                                  ZEXT3648(CONCAT432(mode,CONCAT824(0,CONCAT816(node,CONCAT88(
                                                  colgroup,prvTidyParseColGroup))))));
            return node;
          }
        }
        goto LAB_0013bd4c;
      }
    }
    else {
      if (node->type != EndTag) goto LAB_0013bd1c;
      pNVar6 = colgroup;
      if ((pDVar3 == (Dict *)0x0) || (pDVar3->id != TidyTag_FORM)) {
        while (pNVar6 = pNVar6->parent, pNVar6 != (Node *)0x0) {
          if (pDVar3 == pNVar6->tag) goto LAB_0013bd84;
        }
        goto LAB_0013bd1c;
      }
      *(byte *)&doc->badForm = (byte)doc->badForm | 1;
LAB_0013bd4c:
      prvTidyReport(doc,colgroup,node,0x235);
      prvTidyFreeNode(doc,node);
    }
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
  } while( true );
}

Assistant:

Node* TY_(ParseColGroup)( TidyDocImpl* doc, Node *colgroup, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node, *parent;
    DEBUG_LOG_COUNTERS;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( colgroup == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        colgroup = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(colgroup);
        if (colgroup->tag->model & CM_EMPTY)
            return NULL;
    }

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);

        if (node->tag == colgroup->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            colgroup->closed = yes;
            return NULL;
        }

        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = colgroup->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        if (TY_(nodeIsText)(node))
        {
            TY_(UngetToken)( doc );
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(colgroup, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsCOL(node) )
        {
            TY_(UngetToken)( doc );
            DEBUG_LOG_EXIT;
            return NULL;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* node should be <COL> */
        TY_(InsertNodeAtEnd)(colgroup, node);
        
        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseColGroup);
            memory.original_node = colgroup;
            memory.reentry_node = node;
            memory.mode = mode;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
        }
        DEBUG_LOG_EXIT;
        return node;
    }
    DEBUG_LOG_EXIT;
    return NULL;
}